

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_ReadNL_Test::TestBody(ProblemTest_ReadNL_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  Error *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  SystemError *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Problem p;
  undefined4 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1e;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc3c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffc40;
  Type in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  uint in_stack_fffffffffffffc54;
  ConstCharPtr in_stack_fffffffffffffc58;
  CStringRef in_stack_fffffffffffffc60;
  BasicCStringRef<char> local_380;
  byte local_375;
  char *in_stack_fffffffffffffc98;
  AssertHelper *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffe14;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffe18;
  CStringRef in_stack_fffffffffffffe20;
  NLStringRef in_stack_fffffffffffffe28;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffffc40);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc98,"");
  uVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc98);
  if ((bool)uVar1) {
    local_375 = 0;
    in_stack_fffffffffffffc1e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffc1e) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_380,"nonexistent");
      mp::ReadNLFile<mp::BasicProblem<mp::BasicProblemParams<int>>>
                (in_stack_fffffffffffffc60,
                 (BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffffc58.value,
                 in_stack_fffffffffffffc54);
    }
    if ((local_375 & 1) == 0) {
      in_stack_fffffffffffffc98 =
           "Expected: ReadNLFile(\"nonexistent\", p) throws an exception of type fmt::SystemError.\n  Actual: it throws nothing."
      ;
      goto LAB_001110f3;
    }
  }
  else {
LAB_001110f3:
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               in_stack_fffffffffffffc4c,(char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c
               ,in_stack_fffffffffffffc30);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffca0,(Message *)in_stack_fffffffffffffc98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
    testing::Message::~Message((Message *)0x111149);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc58,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc58);
  if ((bool)uVar2) {
    in_stack_fffffffffffffc54 = in_stack_fffffffffffffc54 & 0xffffff;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::NLStringRef::NLStringRef
                ((NLStringRef *)in_stack_fffffffffffffc20,
                 (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffc1e,
                                                 CONCAT15(uVar2,CONCAT14(bVar3,
                                                  in_stack_fffffffffffffc18)))));
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffffc38,"(input)");
      mp::ReadNLString<mp::BasicProblem<mp::BasicProblemParams<int>>>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe14);
    }
    if ((in_stack_fffffffffffffc54 & 0x1000000) != 0) goto LAB_0011131e;
  }
  testing::Message::Message
            ((Message *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             in_stack_fffffffffffffc4c,(char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
             in_stack_fffffffffffffc30);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffca0,(Message *)in_stack_fffffffffffffc98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
  testing::Message::~Message((Message *)0x1112e8);
LAB_0011131e:
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(in_stack_fffffffffffffc20);
  return;
}

Assistant:

TEST(ProblemTest, ReadNL) {
  mp::Problem p;
  // Just make sure that ReadNLFile and ReadNLString are accessible.
  // They are tested elsewhere.
  EXPECT_THROW(ReadNLFile("nonexistent", p), fmt::SystemError);
  EXPECT_THROW(ReadNLString("", p), mp::Error);
}